

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cc
# Opt level: O2

void bssl::VerifyCertErrors
               (string *expected_errors_str,CertErrors *actual_errors,string *errors_file_path)

{
  bool bVar1;
  pointer *__ptr;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  string actual_errors_str;
  
  CertErrors::ToDebugString_abi_cxx11_(&actual_errors_str,actual_errors);
  bVar1 = ::std::operator!=(expected_errors_str,&actual_errors_str);
  if (bVar1) {
    testing::Message::Message((Message *)&local_48);
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),
                      "Cert errors don\'t match expectations (");
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),(string *)errors_file_path);
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),")\n\n");
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),"EXPECTED:\n\n");
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),(string *)expected_errors_str);
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),"\n");
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),"ACTUAL:\n\n");
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),(string *)&actual_errors_str);
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),"\n");
    ::std::operator<<((ostream *)(local_48._M_head_impl + 0x10),
                      "===> Use pki/testdata/parse_certificate_unittest/rebase-errors.py to rebaseline.\n"
                     );
    testing::internal::AssertHelper::AssertHelper
              (&local_40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/test_helpers.cc"
               ,0x1d6,"Failed");
    testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_48);
    testing::internal::AssertHelper::~AssertHelper(&local_40);
    if (local_48._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_48._M_head_impl + 8))();
    }
  }
  ::std::__cxx11::string::~string((string *)&actual_errors_str);
  return;
}

Assistant:

void VerifyCertErrors(const std::string &expected_errors_str,
                      const CertErrors &actual_errors,
                      const std::string &errors_file_path) {
  std::string actual_errors_str = actual_errors.ToDebugString();

  if (expected_errors_str != actual_errors_str) {
    ADD_FAILURE() << "Cert errors don't match expectations ("
                  << errors_file_path << ")\n\n"
                  << "EXPECTED:\n\n"
                  << expected_errors_str << "\n"
                  << "ACTUAL:\n\n"
                  << actual_errors_str << "\n"
                  << "===> Use "
                     "pki/testdata/parse_certificate_unittest/"
                     "rebase-errors.py to rebaseline.\n";
  }
}